

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::utp_stream::
async_connect<std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>
          (utp_stream *this,endpoint_type *endpoint,
          _Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
          *handler)

{
  io_context *this_00;
  basic_errors local_54;
  type local_50;
  _Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
  *local_20;
  _Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
  *handler_local;
  endpoint_type *endpoint_local;
  utp_stream *this_local;
  
  local_20 = handler;
  handler_local =
       (_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
        *)endpoint;
  endpoint_local = (endpoint_type *)this;
  if (this->m_impl == (utp_socket_impl *)0x0) {
    this_00 = this->m_io_service;
    local_54 = not_connected;
    std::
    bind<void,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>const&,boost::asio::error::basic_errors>
              (&local_50,handler,&local_54);
    boost::asio::io_context::
    post<std::_Bind_result<void,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>(boost::asio::error::basic_errors)>>
              (this_00,&local_50);
    std::
    _Bind_result<void,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_(boost::asio::error::basic_errors)>
    ::~_Bind_result(&local_50);
  }
  else {
    std::function<void(boost::system::error_code_const&)>::operator=
              ((function<void(boost::system::error_code_const&)> *)this,handler);
    do_connect(this,(endpoint *)handler_local);
  }
  return;
}

Assistant:

void async_connect(endpoint_type const& endpoint, Handler const& handler)
	{
		if (m_impl == nullptr)
		{
			m_io_service.post(std::bind<void>(handler, boost::asio::error::not_connected));
			return;
		}

		m_connect_handler = handler;
		do_connect(endpoint);
	}